

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O2

int getgoal(line *dlp)

{
  byte bVar1;
  int col;
  int iVar2;
  ushort **ppuVar3;
  uint uVar4;
  long lVar5;
  char local_35 [8];
  char tmp [5];
  
  col = 0;
  for (lVar5 = 0; lVar5 < dlp->l_used; lVar5 = lVar5 + 1) {
    bVar1 = dlp->l_text[lVar5];
    uVar4 = (uint)bVar1;
    if (uVar4 == 9) {
      col = ntabstop(col,curbp->b_tabw);
    }
    else if ((cinfo[uVar4] & 8U) == 0) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)uVar4 * 2 + 1) & 0x40) == 0) {
        iVar2 = snprintf(local_35,5,"\\%o",(ulong)bVar1);
        col = col + iVar2;
      }
      else {
        col = col + 1;
      }
    }
    else {
      col = col + 2;
    }
    if (curgoal < col) break;
  }
  return (int)lVar5;
}

Assistant:

int
getgoal(struct line *dlp)
{
	int c, i, col = 0;
	char tmp[5];

	for (i = 0; i < llength(dlp); i++) {
		c = lgetc(dlp, i);
		if (c == '\t') {
			col = ntabstop(col, curbp->b_tabw);
		} else if (ISCTRL(c) != FALSE) {
			col += 2;
		} else if (isprint(c))
			col++;
		else {
			col += snprintf(tmp, sizeof(tmp), "\\%o", c);
		}
		if (col > curgoal)
			break;
	}
	return (i);
}